

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O3

size_t __thiscall CoreML::Specification::Optimizer::ByteSizeLong(Optimizer *this)

{
  int iVar1;
  size_t sVar2;
  uint uVar3;
  
  if (this->_oneof_case_[0] == 0xb) {
    sVar2 = AdamOptimizer::ByteSizeLong((this->OptimizerType_).adamoptimizer_);
  }
  else {
    if (this->_oneof_case_[0] != 10) {
      sVar2 = 0;
      goto LAB_00252e8a;
    }
    sVar2 = SGDOptimizer::ByteSizeLong((this->OptimizerType_).sgdoptimizer_);
  }
  uVar3 = (uint)sVar2 | 1;
  iVar1 = 0x1f;
  if (uVar3 != 0) {
    for (; uVar3 >> iVar1 == 0; iVar1 = iVar1 + -1) {
    }
  }
  sVar2 = sVar2 + (iVar1 * 9 + 0x49U >> 6) + 1;
LAB_00252e8a:
  this->_cached_size_ = (int)sVar2;
  return sVar2;
}

Assistant:

size_t Optimizer::ByteSizeLong() const {
// @@protoc_insertion_point(message_byte_size_start:CoreML.Specification.Optimizer)
  size_t total_size = 0;

  switch (OptimizerType_case()) {
    // .CoreML.Specification.SGDOptimizer sgdOptimizer = 10;
    case kSgdOptimizer: {
      total_size += 1 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *OptimizerType_.sgdoptimizer_);
      break;
    }
    // .CoreML.Specification.AdamOptimizer adamOptimizer = 11;
    case kAdamOptimizer: {
      total_size += 1 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *OptimizerType_.adamoptimizer_);
      break;
    }
    case OPTIMIZERTYPE_NOT_SET: {
      break;
    }
  }
  int cached_size = ::google::protobuf::internal::ToCachedSize(total_size);
  GOOGLE_SAFE_CONCURRENT_WRITES_BEGIN();
  _cached_size_ = cached_size;
  GOOGLE_SAFE_CONCURRENT_WRITES_END();
  return total_size;
}